

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<ProString,_QLatin1String>::convertTo<QString>
          (QString *__return_storage_ptr__,QStringBuilder<ProString,_QLatin1String> *this)

{
  int iVar1;
  char16_t *pcVar2;
  CutResult CVar3;
  char16_t *__src;
  long lVar4;
  QChar *__dest;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->b).m_data == (char *)0x0 && (this->a).m_string.d.ptr == (char16_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0025ce64:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    iVar1 = (this->a).m_length;
    lVar4 = (this->b).m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,iVar1 + lVar4,Uninitialized);
    __dest = (QChar *)(__return_storage_ptr__->d).ptr;
    lVar4 = (long)(this->a).m_length;
    if (lVar4 != 0) {
      pcVar2 = (this->a).m_string.d.ptr;
      local_40 = (long)(this->a).m_offset;
      local_48 = lVar4;
      CVar3 = QtPrivate::QContainerImplHelper::mid((this->a).m_string.d.size,&local_40,&local_48);
      __src = (char16_t *)0x0;
      if (CVar3 != Null) {
        __src = pcVar2 + local_40;
      }
      memcpy(__dest,__src,lVar4 * 2);
      __dest = __dest + lVar4;
    }
    QAbstractConcatenable::appendLatin1To(this->b,__dest);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0025ce64;
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }